

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<128>,unsigned_long>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  ulong uVar2;
  void *__s;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 in_XMM7_Qb;
  unsigned_long h2;
  unsigned_long h1;
  Blob<128> key;
  uint local_98;
  uint local_94;
  void *local_80;
  ulong local_68;
  ulong local_60;
  Rand local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  local_48 = 0;
  uStack_40 = 0;
  __s = operator_new(0x800000);
  lVar10 = 0;
  memset(__s,0,0x800000);
  lVar8 = (long)__s + 0x10;
  do {
    if ((byte)((byte)((char)lVar10 * -0x55) >> 2 | (char)lVar10 * -0x40) < 0x16) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar11 = 0;
      do {
        Rand::rand_p(&local_58,&local_48,0x10);
        (*hash)(&local_48,0x10,0,&local_60);
        flipbit(&local_48,0x10,(uint32_t)lVar10);
        (*hash)(&local_48,0x10,0,&local_68);
        uVar3 = 1;
        uVar5 = 0;
        lVar4 = lVar8;
        do {
          uVar7 = uVar5 & 0x3f;
          uVar5 = uVar5 + 1;
          lVar6 = lVar4 + (ulong)((uint)((local_68 ^ local_60) >> uVar7) & 1) * 4;
          uVar7 = uVar3;
          do {
            uVar2 = uVar7 & 0x3f;
            uVar7 = uVar7 + 1;
            piVar1 = (int *)(lVar6 + (ulong)((uint)((local_68 ^ local_60) >> uVar2) & 1) * 8);
            *piVar1 = *piVar1 + 1;
            lVar6 = lVar6 + 0x10;
          } while (uVar7 != 0x40);
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x410;
        } while (uVar5 != 0x3f);
        iVar11 = iVar11 + 1;
      } while (iVar11 != reps);
    }
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 0x10000;
  } while (lVar10 != 0x80);
  putchar(10);
  auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar7 = 1;
  uVar5 = 0;
  local_98 = 0;
  local_94 = 0;
  auVar14 = ZEXT864(0) << 0x40;
  uVar3 = 0;
  local_80 = __s;
LAB_0012984c:
  uVar2 = uVar3 + 1;
  uVar12 = uVar7;
LAB_0012985a:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar3 & 0xffffffff,uVar12 & 0xffffffff);
    auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar14 = ZEXT864(auVar14._0_8_);
  }
  uVar9 = 0;
LAB_001298ab:
  do {
    auVar17 = ZEXT864(0) << 0x40;
    lVar8 = 0;
    do {
      lVar10 = lVar8 * 4;
      lVar8 = lVar8 + 1;
      auVar15._0_8_ =
           (double)*(int *)((long)local_80 + lVar10 + uVar9 * 0x10000 + uVar12 * 0x10) /
           (double)(reps / 2);
      auVar15._8_8_ = in_XMM7_Qb;
      auVar15 = vfmadd213sd_fma(auVar15,auVar18._0_16_,auVar19._0_16_);
      auVar15 = vandpd_avx(auVar15,auVar20._0_16_);
      auVar15 = vmaxsd_avx(auVar15,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar15);
    } while (lVar8 != 4);
    dVar16 = auVar15._0_8_;
    if (auVar14._0_8_ < dVar16) {
      uVar5 = uVar9 & 0xffffffff;
      auVar14 = ZEXT1664(auVar15);
      local_98 = (uint)uVar3;
      local_94 = (uint)uVar12;
    }
    if (!verbose) goto LAB_00129971;
    iVar11 = 0x2e;
    uVar13 = auVar14._0_8_;
    if ((0.01 <= dVar16) && (iVar11 = 0x6f, 0.05 <= dVar16)) {
      iVar11 = (uint)(0.33 <= dVar16) * 9 + 0x4f;
    }
    putchar(iVar11);
    auVar14 = ZEXT864(uVar13);
    auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x80);
  if (verbose) {
    putchar(10);
    auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar14 = ZEXT864(uVar13);
    uVar12 = uVar12 + 1;
    if (uVar12 == 0x40) {
      iVar11 = 0x8c;
      do {
        putchar(0x2d);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      putchar(10);
      auVar14 = ZEXT864(uVar13);
      auVar18 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar19 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar20 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_00129a15;
    }
    goto LAB_0012985a;
  }
  goto LAB_001299c5;
LAB_00129971:
  uVar9 = uVar9 + 1;
  if (uVar9 == 0x80) goto LAB_001299c5;
  goto LAB_001298ab;
LAB_001299c5:
  uVar12 = uVar12 + 1;
  if (uVar12 == 0x40) goto LAB_00129a15;
  goto LAB_0012985a;
LAB_00129a15:
  local_80 = (void *)((long)local_80 + 0x400);
  uVar7 = uVar7 + 1;
  uVar3 = uVar2;
  if (uVar2 == 0x3f) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar5,(ulong)local_98,(ulong)local_94);
    operator_delete(__s);
    return auVar14._0_8_ < 0.05;
  }
  goto LAB_0012984c;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}